

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O2

void __thiscall
duckdb::HistogramBinState<duckdb::string_t>::InitializeBins<duckdb::HistogramGenericFunctor>
          (HistogramBinState<duckdb::string_t> *this,Vector *bin_vector,idx_t count,idx_t pos,
          AggregateInputData *aggr_input)

{
  vector<duckdb::string_t,_std::allocator<duckdb::string_t>_> *this_00;
  pointer psVar1;
  unsafe_vector<duckdb::string_t> *puVar2;
  unsafe_vector<idx_t> *puVar3;
  Vector *input;
  idx_t iVar4;
  BinderException *pBVar5;
  idx_t offset;
  ulong idx;
  size_type __n;
  bool bVar6;
  allocator local_159;
  size_type local_158;
  AggregateInputData *local_150;
  anon_union_16_2_67f50693_for_value local_148 [2];
  UnifiedVectorFormat bin_child_data;
  UnifiedVectorFormat bin_data;
  Vector extra_state;
  
  local_150 = aggr_input;
  puVar2 = (unsafe_vector<duckdb::string_t> *)operator_new(0x18);
  (puVar2->super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>).
  super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (puVar2->super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>).
  super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (puVar2->super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>).
  super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->bin_boundaries = puVar2;
  puVar3 = (unsafe_vector<idx_t> *)operator_new(0x18);
  (puVar3->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (puVar3->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (puVar3->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->counts = puVar3;
  UnifiedVectorFormat::UnifiedVectorFormat(&bin_data);
  Vector::ToUnifiedFormat(bin_vector,count,&bin_data);
  if ((bin_data.sel)->sel_vector != (sel_t *)0x0) {
    pos = (idx_t)(bin_data.sel)->sel_vector[pos];
  }
  offset = *(idx_t *)(bin_data.data + pos * 0x10);
  __n = *(size_type *)(bin_data.data + pos * 0x10 + 8);
  if ((bin_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
       (unsigned_long *)0x0) &&
     ((bin_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[pos >> 6] >>
       (pos & 0x3f) & 1) == 0)) {
    pBVar5 = (BinderException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&extra_state,"Histogram bin list cannot be NULL",
               (allocator *)&bin_child_data);
    BinderException::BinderException(pBVar5,(string *)&extra_state);
    __cxa_throw(pBVar5,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  input = ListVector::GetEntry(bin_vector);
  iVar4 = ListVector::GetListSize(bin_vector);
  UnifiedVectorFormat::UnifiedVectorFormat(&bin_child_data);
  HistogramGenericFunctor::CreateExtraState(&extra_state,iVar4);
  HistogramGenericFunctor::PrepareData(input,iVar4,&extra_state,&bin_child_data);
  ::std::vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>::reserve
            (&this->bin_boundaries->
              super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>,__n);
  local_158 = __n;
  while( true ) {
    bVar6 = __n == 0;
    __n = __n - 1;
    if (bVar6) {
      ::std::
      __sort<__gnu_cxx::__normal_iterator<duckdb::string_t*,std::vector<duckdb::string_t,std::allocator<duckdb::string_t>>>,__gnu_cxx::__ops::_Iter_less_iter>
                ((this->bin_boundaries->
                 super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>).
                 super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (this->bin_boundaries->
                 super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>).
                 super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      for (idx = 1; psVar1 = (this->bin_boundaries->
                             super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>).
                             super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>
                             ._M_impl.super__Vector_impl_data._M_start,
          idx < (ulong)((long)(this->bin_boundaries->
                              super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>).
                              super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4);
          idx = idx + 1) {
        bVar6 = string_t::StringComparisonOperators::Equals(psVar1 + (idx - 1),psVar1 + idx);
        if (bVar6) {
          vector<duckdb::string_t,_false>::unsafe_erase_at(this->bin_boundaries,idx);
          idx = idx - 1;
        }
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this->counts,local_158 + 1
                );
      Vector::~Vector(&extra_state);
      UnifiedVectorFormat::~UnifiedVectorFormat(&bin_child_data);
      UnifiedVectorFormat::~UnifiedVectorFormat(&bin_data);
      return;
    }
    iVar4 = offset;
    if ((bin_child_data.sel)->sel_vector != (sel_t *)0x0) {
      iVar4 = (idx_t)(bin_child_data.sel)->sel_vector[offset];
    }
    if ((bin_child_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
         (unsigned_long *)0x0) &&
       ((bin_child_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
         [iVar4 >> 6] >> (iVar4 & 0x3f) & 1) == 0)) break;
    this_00 = &this->bin_boundaries->
               super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>;
    local_148[0].pointer =
         (anon_struct_16_3_d7536bce_for_pointer)
         HistogramStringFunctorBase::ExtractValue<duckdb::string_t>
                   (&bin_child_data,offset,local_150);
    ::std::vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>::
    emplace_back<duckdb::string_t>(this_00,(string_t *)&local_148[0].pointer);
    offset = offset + 1;
  }
  pBVar5 = (BinderException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_148[0].pointer,"Histogram bin entry cannot be NULL",&local_159);
  BinderException::BinderException(pBVar5,(string *)&local_148[0].pointer);
  __cxa_throw(pBVar5,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void InitializeBins(Vector &bin_vector, idx_t count, idx_t pos, AggregateInputData &aggr_input) {
		bin_boundaries = new unsafe_vector<T>();
		counts = new unsafe_vector<idx_t>();
		UnifiedVectorFormat bin_data;
		bin_vector.ToUnifiedFormat(count, bin_data);
		auto bin_counts = UnifiedVectorFormat::GetData<list_entry_t>(bin_data);
		auto bin_index = bin_data.sel->get_index(pos);
		auto bin_list = bin_counts[bin_index];
		if (!bin_data.validity.RowIsValid(bin_index)) {
			throw BinderException("Histogram bin list cannot be NULL");
		}

		auto &bin_child = ListVector::GetEntry(bin_vector);
		auto bin_count = ListVector::GetListSize(bin_vector);
		UnifiedVectorFormat bin_child_data;
		auto extra_state = OP::CreateExtraState(bin_count);
		OP::PrepareData(bin_child, bin_count, extra_state, bin_child_data);

		bin_boundaries->reserve(bin_list.length);
		for (idx_t i = 0; i < bin_list.length; i++) {
			auto bin_child_idx = bin_child_data.sel->get_index(bin_list.offset + i);
			if (!bin_child_data.validity.RowIsValid(bin_child_idx)) {
				throw BinderException("Histogram bin entry cannot be NULL");
			}
			bin_boundaries->push_back(OP::template ExtractValue<T>(bin_child_data, bin_list.offset + i, aggr_input));
		}
		// sort the bin boundaries
		std::sort(bin_boundaries->begin(), bin_boundaries->end());
		// ensure there are no duplicate bin boundaries
		for (idx_t i = 1; i < bin_boundaries->size(); i++) {
			if (Equals::Operation((*bin_boundaries)[i - 1], (*bin_boundaries)[i])) {
				bin_boundaries->erase_at(i);
				i--;
			}
		}

		counts->resize(bin_list.length + 1);
	}